

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O0

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::getStdDev
          (Accumulator<OpenMD::Vector<double,_3U>_> *this)

{
  double *pdVar1;
  Vector<double,_3U> *in_RDI;
  double dVar2;
  size_t i;
  Vector<double,_3U> variance;
  Vector<double,_3U> *sd;
  ulong local_30;
  Accumulator<OpenMD::Vector<double,_3U>_> *in_stack_ffffffffffffffd8;
  
  Vector<double,_3U>::Vector(in_RDI);
  getVariance(in_stack_ffffffffffffffd8);
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    pdVar1 = Vector<double,_3U>::operator[]
                       ((Vector<double,_3U> *)&stack0xffffffffffffffd8,(uint)local_30);
    dVar2 = sqrt(*pdVar1);
    pdVar1 = Vector<double,_3U>::operator[](in_RDI,(uint)local_30);
    *pdVar1 = dVar2;
  }
  return in_RDI;
}

Assistant:

Vector<RealType, Dim> getStdDev() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> sd {};
      Vector<RealType, Dim> variance = this->getVariance();

      for (std::size_t i = 0; i < Dim; i++) {
        sd[i] = std::sqrt(variance[i]);
      }

      return sd;
    }